

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void dnscache_entry_free(Curl_dns_entry *dns)

{
  Curl_dns_entry *dns_local;
  
  Curl_freeaddrinfo(dns->addr);
  (*Curl_cfree)(dns);
  return;
}

Assistant:

static void dnscache_entry_free(struct Curl_dns_entry *dns)
{
  Curl_freeaddrinfo(dns->addr);
#ifdef USE_HTTPSRR
  if(dns->hinfo) {
    Curl_httpsrr_cleanup(dns->hinfo);
    free(dns->hinfo);
  }
#endif
  free(dns);
}